

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::end_quoted_string_value
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  reference pvVar1;
  size_type sVar2;
  long lVar3;
  ulong uVar4;
  basic_json_visitor<char> *in_RDI;
  bool in_stack_0000000e;
  bool in_stack_0000000f;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_00000010;
  error_code *in_stack_00000838;
  undefined1 in_stack_00000847;
  basic_json_visitor<char> *in_stack_00000848;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_00000850;
  error_code *in_stack_ffffffffffffffc8;
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
  *in_stack_ffffffffffffffd0;
  ser_context *context;
  semantic_tag tag;
  
  pvVar1 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                     (in_stack_ffffffffffffffd0);
  if (*pvVar1 == data || *pvVar1 == subfields) {
    if ((((ulong)in_RDI[0xc]._vptr_basic_json_visitor & 0x100000000) != 0) ||
       (((ulong)in_RDI[0xc]._vptr_basic_json_visitor & 0x1000000000000) != 0)) {
      trim_string_buffer(in_stack_00000010,in_stack_0000000f,in_stack_0000000e);
    }
    tag = *(semantic_tag *)((long)&in_RDI[10]._vptr_basic_json_visitor + 4);
    if (tag == noesc) {
      end_value(in_stack_00000850,in_stack_00000848,(bool)in_stack_00000847,in_stack_00000838);
    }
    else if (tag == bigint) {
      if ((((ulong)in_RDI[10]._vptr_basic_json_visitor & 1) == 0) ||
         (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        context = (ser_context *)in_RDI[0xe]._vptr_basic_json_visitor;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x2d));
        if (context < (ser_context *)(sVar2 + (long)in_RDI[0x11]._vptr_basic_json_visitor)) {
          if ((((ulong)in_RDI[0xc]._vptr_basic_json_visitor & 0x100000000000000) == 0) ||
             (lVar3 = std::__cxx11::string::length(), lVar3 != 0)) {
            end_value(in_stack_00000850,in_stack_00000848,(bool)in_stack_00000847,in_stack_00000838)
            ;
          }
          else {
            basic_json_visitor<char>::null_value(in_RDI,tag,context,in_stack_ffffffffffffffc8);
            *(byte *)&in_RDI[0x19]._vptr_basic_json_visitor =
                 (*(byte *)&in_RDI[0x1b]._vptr_basic_json_visitor ^ 0xff) & 1;
          }
        }
        else if (in_RDI[0x10]._vptr_basic_json_visitor != (_func_int **)0x0) {
          if ((((ulong)in_RDI[0xc]._vptr_basic_json_visitor & 0x100000000000000) == 0) ||
             (lVar3 = std::__cxx11::string::length(), lVar3 != 0)) {
            end_value(in_stack_00000850,in_stack_00000848,(bool)in_stack_00000847,in_stack_00000838)
            ;
          }
          else {
            basic_json_visitor<char>::null_value(in_RDI,tag,context,in_stack_ffffffffffffffc8);
            *(byte *)&in_RDI[0x19]._vptr_basic_json_visitor =
                 (*(byte *)&in_RDI[0x1b]._vptr_basic_json_visitor ^ 0xff) & 1;
          }
        }
      }
    }
    else if (tag == bigdec) {
      if ((((ulong)in_RDI[10]._vptr_basic_json_visitor & 1) == 0) ||
         (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
        end_value(in_stack_00000850,in_stack_00000848,(bool)in_stack_00000847,in_stack_00000838);
      }
      else {
        detail::m_columns_filter<char,_std::allocator<char>_>::skip_column
                  ((m_columns_filter<char,_std::allocator<char>_> *)(in_RDI + 0x1d));
      }
    }
  }
  return;
}

Assistant:

void end_quoted_string_value(basic_json_visitor<CharT>& visitor, 
        std::error_code& ec) 
    {
        switch (stack_.back())
        {
            case csv_mode::data:
            case csv_mode::subfields:
                if (trim_leading_inside_quotes_ || trim_trailing_inside_quotes_)
                {
                    trim_string_buffer(trim_leading_inside_quotes_,trim_trailing_inside_quotes_);
                }
                switch (mapping_kind_)
                {
                case csv_mapping_kind::n_rows:
                    end_value(visitor, false, ec);
                    break;
                case csv_mapping_kind::n_objects:
                    if (!(ignore_empty_values_ && buffer_.empty()))
                    {
                        if (column_index_ < column_names_.size() + offset_)
                        {
                            if (unquoted_empty_value_is_null_ && buffer_.length() == 0)
                            {
                                visitor.null_value(semantic_tag::none, *this, ec);
                                more_ = !cursor_mode_;
                            }
                            else 
                            {
                                end_value(visitor, false, ec);
                            }
                        }
                        else if (depth_ > 0)
                        {
                            if (unquoted_empty_value_is_null_ && buffer_.length() == 0)
                            {
                                visitor.null_value(semantic_tag::none, *this, ec);
                                more_ = !cursor_mode_;
                            }
                            else
                            {
                                end_value(visitor, false, ec);
                            }
                        }
                    }
                    break;
                case csv_mapping_kind::m_columns:
                    if (!(ignore_empty_values_ && buffer_.empty()))
                    {
                        end_value(visitor, false, ec);
                    }
                    else
                    {
                        m_columns_filter_.skip_column();
                    }
                    break;
                }
                break;
            default:
                break;
        }
    }